

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionBeamData.cpp
# Opt level: O2

void __thiscall
DIS::ElectromagneticEmissionBeamData::marshal
          (ElectromagneticEmissionBeamData *this,DataStream *dataStream)

{
  pointer pTVar1;
  ulong uVar2;
  long lVar3;
  TrackJamData x;
  
  DataStream::operator<<(dataStream,this->_beamDataLength);
  DataStream::operator<<(dataStream,this->_beamIDNumber);
  DataStream::operator<<(dataStream,this->_beamParameterIndex);
  EEFundamentalParameterData::marshal(&this->_fundamentalParameterData,dataStream);
  BeamData::marshal(&this->_beamData,dataStream);
  DataStream::operator<<(dataStream,this->_beamFunction);
  DataStream::operator<<
            (dataStream,
             (uchar)(((long)(this->_trackJamTargets).
                            super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_trackJamTargets).
                           super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x30));
  DataStream::operator<<(dataStream,this->_highDensityTrackJam);
  DataStream::operator<<(dataStream,this->_beamStatus);
  JammingTechnique::marshal(&this->_jammingTechnique,dataStream);
  lVar3 = 0x28;
  uVar2 = 0;
  while( true ) {
    pTVar1 = (this->_trackJamTargets).
             super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_trackJamTargets).
                       super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x30) <= uVar2)
    break;
    x._vptr_TrackJamData = (_func_int **)&PTR__TrackJamData_001c3470;
    x._entityID._vptr_EntityID = (_func_int **)&PTR__EntityID_001c15b0;
    x._entityID._simulationAddress._vptr_SimulationAddress =
         (_func_int **)&PTR__SimulationAddress_001c2fb8;
    x._entityID._simulationAddress._8_4_ = *(undefined4 *)((long)pTVar1 + lVar3 + -0x10);
    x._entityID._entityNumber = *(unsigned_short *)((long)pTVar1 + lVar3 + -8);
    x._40_2_ = *(undefined2 *)((long)&pTVar1->_vptr_TrackJamData + lVar3);
    TrackJamData::marshal(&x,dataStream);
    TrackJamData::~TrackJamData(&x);
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x30;
  }
  return;
}

Assistant:

void ElectromagneticEmissionBeamData::marshal(DataStream& dataStream) const
{
    dataStream << _beamDataLength;
    dataStream << _beamIDNumber;
    dataStream << _beamParameterIndex;
    _fundamentalParameterData.marshal(dataStream);
	_beamData.marshal(dataStream);
    dataStream << _beamFunction;
    dataStream << ( unsigned char )_trackJamTargets.size();
    dataStream << _highDensityTrackJam;
    dataStream << _beamStatus;
    _jammingTechnique.marshal(dataStream);

     for(size_t idx = 0; idx < _trackJamTargets.size(); idx++)
     {
        TrackJamData x = _trackJamTargets[idx];
        x.marshal(dataStream);
     }

}